

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O1

int jbcoin::Serializer::decodeLengthLength(int b1)

{
  int iVar1;
  
  if (b1 < 0) {
    Throw<std::overflow_error,char_const(&)[5]>((char (*) [5])"b1<0");
  }
  iVar1 = 1;
  if (((0xc0 < b1) && (iVar1 = 2, 0xf0 < b1)) && (iVar1 = 3, 0xfe < b1)) {
    Throw<std::overflow_error,char_const(&)[7]>((char (*) [7])"b1>254");
  }
  return iVar1;
}

Assistant:

int Serializer::decodeLengthLength (int b1)
{
    if (b1 < 0) Throw<std::overflow_error> ("b1<0");

    if (b1 <= 192) return 1;

    if (b1 <= 240) return 2;

    if (b1 <= 254) return 3;

    Throw<std::overflow_error> ("b1>254");
    return 0; // Silence compiler warning.
}